

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O1

void * utf8pbrk(void *str,void *accept)

{
  char *in_RAX;
  char *pcVar1;
  char cVar2;
  bool bVar3;
  
  do {
    if (*str == '\0') {
      return (void *)0x0;
    }
    cVar2 = *accept;
    if (cVar2 == '\0') {
LAB_001117ab:
      str = (void *)((long)str + 1);
      bVar3 = true;
    }
    else {
      bVar3 = false;
      pcVar1 = (char *)accept;
      do {
        if (bVar3) goto LAB_001117a4;
        bVar3 = cVar2 == *str;
        pcVar1 = pcVar1 + 1;
        cVar2 = *pcVar1;
      } while (cVar2 != '\0');
      if (!bVar3) goto LAB_001117ab;
LAB_001117a4:
      bVar3 = false;
      in_RAX = (char *)str;
    }
    if (!bVar3) {
      return in_RAX;
    }
  } while( true );
}

Assistant:

void *utf8pbrk(const void *str, const void *accept) {
  const char *s = (const char *)str;

  while ('\0' != *s) {
    const char *a = (const char *)accept;
    size_t offset = 0;

    while ('\0' != *a) {
      // checking that if *a is the start of a utf8 codepoint
      // (it is not 0b10xxxxxx) and we have successfully matched
      // a previous character (0 < offset) - we found a match
      if ((0x80 != (0xc0 & *a)) && (0 < offset)) {
        return (void *)s;
      } else {
        if (*a == s[offset]) {
          // part of a utf8 codepoint matched, so move our checking
          // onwards to the next byte
          offset++;
          a++;
        } else {
          // r could be in the middle of an unmatching utf8 code point,
          // so we need to march it on to the next character beginning,

          do {
            a++;
          } while (0x80 == (0xc0 & *a));

          // reset offset too as we found a mismatch
          offset = 0;
        }
      }
    }

    // we found a match on the last utf8 codepoint
    if (0 < offset) {
      return (void *)s;
    }

    // the current utf8 codepoint in src did not match accept, but src
    // could have been partway through a utf8 codepoint, so we need to
    // march it onto the next utf8 codepoint starting byte
    do {
      s++;
    } while ((0x80 == (0xc0 & *s)));
  }

  return 0;
}